

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server.cpp
# Opt level: O0

Server * __thiscall Server::byteToHex_abi_cxx11_(Server *this,uint8_t *data,uint16_t length)

{
  long lVar1;
  ulong uVar2;
  allocator *paVar3;
  Server *this_00;
  char *pcVar4;
  ushort in_CX;
  undefined6 in_register_00000012;
  undefined8 uStack_80;
  ulong local_78;
  allocator *local_70;
  Server *local_68;
  Server *local_60;
  char *local_58;
  allocator local_3d;
  int local_3c;
  ulong uStack_38;
  int j;
  unsigned_long __vla_expr0;
  long lStack_20;
  uint16_t length_local;
  uint8_t *data_local;
  Server *this_local;
  
  lStack_20 = CONCAT62(in_register_00000012,length);
  __vla_expr0 = (unsigned_long)&local_78;
  uStack_38 = (ulong)((uint)in_CX * 2);
  lVar1 = -(ulong)((uint)in_CX * 2 + 0xf & 0xfffffff0);
  local_58 = (char *)((long)&local_78 + lVar1);
  for (local_3c = 0; local_3c < (int)(uint)in_CX; local_3c = local_3c + 1) {
    local_58[local_3c << 1] = "0123456789abcdef"[(int)(uint)*(byte *)(lStack_20 + local_3c) >> 4];
    local_58[local_3c * 2 + 1] = "0123456789abcdef"[(int)(*(byte *)(lStack_20 + local_3c) & 0xf)];
  }
  local_78 = (ulong)((uint)in_CX * 2);
  local_70 = &local_3d;
  local_68 = this;
  local_60 = this;
  data_local = data;
  this_local = this;
  *(undefined8 *)((long)&uStack_80 + lVar1) = 0x113b1d;
  std::allocator<char>::allocator();
  pcVar4 = local_58;
  this_00 = local_68;
  paVar3 = local_70;
  uVar2 = local_78;
  *(undefined8 *)((long)&uStack_80 + lVar1) = 0x113b32;
  std::__cxx11::string::string((string *)this_00,pcVar4,uVar2,paVar3);
  *(undefined8 *)((long)&uStack_80 + lVar1) = 0x113b3d;
  std::allocator<char>::~allocator((allocator<char> *)&local_3d);
  return local_60;
}

Assistant:

string Server::byteToHex(const uint8_t *data, uint16_t length) {
    //If we ever decide to use upper case letters here, make sure to change all tolower transforms to toupper transforms!

    char hexString[length * 2];
    static const char hexChars[16] = {'0', '1', '2', '3', '4', '5', '6', '7', '8', '9', 'a', 'b', 'c', 'd', 'e', 'f'};

    for (int j = 0; j < length; j++) {
        hexString[j*2] = hexChars[((data[j] >> 4) & 0xF)];
        hexString[(j*2) + 1] = hexChars[(data[j]) & 0x0F];
    }

    return string(hexString, length * 2);
}